

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqldriver.cpp
# Opt level: O1

void QSqlDriver::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  undefined4 local_4c;
  void *local_48;
  void *pvStack_40;
  undefined4 *local_38;
  void *pvStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      uVar1 = (**(code **)(*(long *)_o + 0x108))(_o);
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(undefined1 *)*_a = uVar1;
      }
    }
    else if (_id == 0) {
      pvStack_40 = _a[1];
      local_4c = *_a[2];
      pvStack_30 = _a[3];
      local_38 = &local_4c;
      local_48 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_48);
    }
    if (_c != ReadProperty) {
      if (_c != WriteProperty) {
        if (_c != IndexOfMethod) goto switchD_0011fbe8_caseD_3;
        goto switchD_0011fbe8_caseD_5;
      }
      goto switchD_0011fbe8_caseD_2;
    }
    break;
  case ReadProperty:
    break;
  case WriteProperty:
switchD_0011fbe8_caseD_2:
    if (_id != 0) goto switchD_0011fbe8_caseD_3;
    goto LAB_0011fcb4;
  default:
    goto switchD_0011fbe8_caseD_3;
  case IndexOfMethod:
switchD_0011fbe8_caseD_5:
    if ((*_a[1] == notification) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0011fbe8_caseD_3;
    }
    if (_c == WriteProperty) goto switchD_0011fbe8_caseD_2;
    if (_c != ReadProperty) goto switchD_0011fbe8_caseD_3;
  }
  if (_id == 0) {
    *(undefined4 *)*_a = *(undefined4 *)(*(long *)(_o + 8) + 0x98);
  }
  if (_c == WriteProperty && _id == 0) {
LAB_0011fcb4:
    *(undefined4 *)(*(long *)(_o + 8) + 0x98) = **_a;
  }
switchD_0011fbe8_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlDriver::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSqlDriver *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->notification((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSqlDriver::NotificationSource>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3]))); break;
        case 1: { bool _r = _t->cancelQuery();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSqlDriver::*)(const QString & , QSqlDriver::NotificationSource , const QVariant & )>(_a, &QSqlDriver::notification, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v) = _t->numericalPrecisionPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNumericalPrecisionPolicy(*reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v)); break;
        default: break;
        }
    }
}